

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcElement::~IfcElement(IfcElement *this,void **vtt)

{
  void *pvVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcProduct).super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcProduct).super_IfcObject.field_0x0 + *(long *)((long)pvVar1 + -0x18))
       = vtt[0x19];
  *(void **)&(this->super_IfcProduct).super_IfcObject.field_0x88 = vtt[0x1a];
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x1b];
  *(void **)&(this->super_IfcProduct).super_IfcObject.field_0xd0 = vtt[0x1c];
  *(void **)&(this->super_IfcProduct).field_0x100 = vtt[0x1d];
  puVar2 = *(undefined1 **)&(this->super_IfcProduct).field_0x110;
  if (puVar2 != &this->field_0x120) {
    operator_delete(puVar2,*(long *)&this->field_0x120 + 1);
  }
  pvVar1 = vtt[2];
  *(void **)&(this->super_IfcProduct).super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcProduct).super_IfcObject.field_0x0 + *(long *)((long)pvVar1 + -0x18))
       = vtt[0xe];
  *(void **)&(this->super_IfcProduct).super_IfcObject.field_0x88 = vtt[0xf];
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x10];
  puVar3 = *(undefined1 **)
            &(this->super_IfcProduct).super_IfcObject.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10;
  puVar2 = &(this->super_IfcProduct).super_IfcObject.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x20;
  if (puVar3 != puVar2) {
    operator_delete(puVar3,*(long *)puVar2 + 1);
  }
  pvVar1 = vtt[4];
  *(void **)&(this->super_IfcProduct).super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcProduct).super_IfcObject.field_0x0 + *(long *)((long)pvVar1 + -0x18))
       = vtt[7];
  puVar3 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x60;
  puVar2 = &(this->super_IfcProduct).super_IfcObject.field_0x70;
  if (puVar3 != puVar2) {
    operator_delete(puVar3,*(long *)puVar2 + 1);
  }
  puVar3 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x38;
  puVar2 = &(this->super_IfcProduct).super_IfcObject.field_0x48;
  if (puVar3 != puVar2) {
    operator_delete(puVar3,*(long *)puVar2 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x10;
  puVar3 = &(this->super_IfcProduct).super_IfcObject.field_0x20;
  if (puVar2 != puVar3) {
    operator_delete(puVar2,*(long *)puVar3 + 1);
    return;
  }
  return;
}

Assistant:

IfcElement() : Object("IfcElement") {}